

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O2

SinkFinalizeType __thiscall
duckdb::PhysicalHashAggregate::FinalizeDistinct
          (PhysicalHashAggregate *this,Pipeline *pipeline,Event *event,ClientContext *context,
          GlobalSinkState *gstate_p)

{
  const_reference pvVar1;
  type pDVar2;
  reference pvVar3;
  type pDVar4;
  reference pvVar5;
  reference this_00;
  type gstate_p_00;
  pointer this_01;
  ulong __n;
  idx_t table_idx;
  ulong __n_00;
  shared_ptr<duckdb::Event,_true> local_58;
  shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_true> new_event;
  
  for (__n = 0; __n < (ulong)(((long)(this->groupings).
                                     super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                     .
                                     super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->groupings).
                                    super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                    .
                                    super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x70);
      __n = __n + 1) {
    pvVar1 = vector<duckdb::HashAggregateGroupingData,_true>::get<true>(&this->groupings,__n);
    pDVar2 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
             ::operator*(&pvVar1->distinct_data);
    pvVar3 = vector<duckdb::HashAggregateGroupingGlobalState,_true>::get<true>
                       ((vector<duckdb::HashAggregateGroupingGlobalState,_true> *)(gstate_p + 1),__n
                       );
    pDVar4 = unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
             ::operator*(&pvVar3->distinct_state);
    for (__n_00 = 0;
        __n_00 < (ulong)((long)(pDVar2->radix_tables).
                               super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pDVar2->radix_tables).
                               super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); __n_00 = __n_00 + 1)
    {
      pvVar5 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
               ::get<true>(&pDVar2->radix_tables,__n_00);
      if ((pvVar5->
          super_unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::RadixPartitionedHashTable_*,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
          .super__Head_base<0UL,_duckdb::RadixPartitionedHashTable_*,_false>._M_head_impl !=
          (RadixPartitionedHashTable *)0x0) {
        pvVar5 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                 ::get<true>(&pDVar2->radix_tables,__n_00);
        this_00 = vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
                  ::get<true>(&pDVar4->radix_states,__n_00);
        gstate_p_00 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                      ::operator*(this_00);
        this_01 = unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                  ::operator->(pvVar5);
        RadixPartitionedHashTable::Finalize(this_01,context,gstate_p_00);
      }
    }
  }
  make_shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,duckdb::ClientContext&,duckdb::Pipeline&,duckdb::PhysicalHashAggregate_const&,duckdb::HashAggregateGlobalSinkState&>
            ((ClientContext *)&new_event,(Pipeline *)context,(PhysicalHashAggregate *)pipeline,
             (HashAggregateGlobalSinkState *)this);
  local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       new_event.internal.
       super___shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = new_event.internal.
         super___shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  new_event.internal.
  super___shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  new_event.internal.
  super___shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Event::InsertEvent(event,&local_58);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&new_event.internal.
              super___shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return READY;
}

Assistant:

SinkFinalizeType PhysicalHashAggregate::FinalizeDistinct(Pipeline &pipeline, Event &event, ClientContext &context,
                                                         GlobalSinkState &gstate_p) const {
	auto &gstate = gstate_p.Cast<HashAggregateGlobalSinkState>();
	D_ASSERT(distinct_collection_info);

	for (idx_t i = 0; i < groupings.size(); i++) {
		auto &grouping = groupings[i];
		auto &distinct_data = *grouping.distinct_data;
		auto &distinct_state = *gstate.grouping_states[i].distinct_state;

		for (idx_t table_idx = 0; table_idx < distinct_data.radix_tables.size(); table_idx++) {
			if (!distinct_data.radix_tables[table_idx]) {
				continue;
			}
			auto &radix_table = distinct_data.radix_tables[table_idx];
			auto &radix_state = *distinct_state.radix_states[table_idx];
			radix_table->Finalize(context, radix_state);
		}
	}
	auto new_event = make_shared_ptr<HashAggregateDistinctFinalizeEvent>(context, pipeline, *this, gstate);
	event.InsertEvent(std::move(new_event));
	return SinkFinalizeType::READY;
}